

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkSampleLocationsInfoEXT *info,ScratchAllocator *alloc)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  void *pvVar5;
  size_t size;
  
  puVar4 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
  if (puVar4 != (undefined8 *)0x0) {
    uVar1 = *(undefined8 *)info;
    pvVar5 = info->pNext;
    uVar2 = *(undefined8 *)&info->sampleLocationsPerPixel;
    uVar3 = *(undefined8 *)&(info->sampleLocationGridSize).height;
    puVar4[4] = info->pSampleLocations;
    puVar4[2] = uVar2;
    puVar4[3] = uVar3;
    *puVar4 = uVar1;
    puVar4[1] = pvVar5;
  }
  if ((ulong)*(uint *)((long)puVar4 + 0x1c) == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    __src = (void *)puVar4[4];
    size = (ulong)*(uint *)((long)puVar4 + 0x1c) << 3;
    pvVar5 = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (pvVar5 != (void *)0x0) {
      memmove(pvVar5,__src,size);
    }
  }
  puVar4[4] = pvVar5;
  return puVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkSampleLocationsInfoEXT *info, ScratchAllocator &alloc)
{
	auto *loc = copy(info, 1, alloc);
	loc->pSampleLocations = copy(loc->pSampleLocations, loc->sampleLocationsCount, alloc);
	return loc;
}